

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void wasm::PrintExpressionContents::printRMWSize(ostream *o,Type type,uint8_t bytes)

{
  uint uVar1;
  ostream *poVar2;
  long lVar3;
  Type type_00;
  char *pcVar4;
  Type local_30;
  Type type_local;
  
  local_30.id = type.id;
  Colors::outputColorCode(o,"\x1b[35m");
  Colors::outputColorCode(o,"\x1b[1m");
  type_00.id = 2;
  if (2 < local_30.id) {
    type_00.id = local_30.id;
  }
  poVar2 = wasm::operator<<(o,type_00);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,".atomic.rmw",0xb);
  if (local_30.id == 1) goto LAB_00a44dc1;
  uVar1 = wasm::Type::getByteSize(&local_30);
  if (uVar1 == bytes) goto LAB_00a44dc1;
  if (bytes == '\x04') {
    pcVar4 = "32";
LAB_00a44db4:
    lVar3 = 2;
  }
  else {
    if (bytes == 2) {
      pcVar4 = "16";
      goto LAB_00a44db4;
    }
    if (bytes != '\x01') {
      handle_unreachable("invalid RMW byte length",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                         ,0x29d);
    }
    pcVar4 = (char *)((long)&type_local.id + 7);
    type_local.id._7_1_ = 0x38;
    lVar3 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar4,lVar3);
LAB_00a44dc1:
  type_local.id._6_1_ = 0x2e;
  std::__ostream_insert<char,std::char_traits<char>>(o,(char *)((long)&type_local.id + 6),1);
  return;
}

Assistant:

static void printRMWSize(std::ostream& o, Type type, uint8_t bytes) {
    prepareColor(o) << forceConcrete(type) << ".atomic.rmw";
    if (type != Type::unreachable && bytes != type.getByteSize()) {
      if (bytes == 1) {
        o << '8';
      } else if (bytes == 2) {
        o << "16";
      } else if (bytes == 4) {
        o << "32";
      } else {
        WASM_UNREACHABLE("invalid RMW byte length");
      }
    }
    o << '.';
  }